

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TReflectionTraverser::getOffsets
          (TReflectionTraverser *this,TType *type,TVector<int> *offsets)

{
  TTypeList *pTVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int offset;
  int memberSize;
  int local_38;
  int local_34;
  
  iVar2 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar2 != '\0') {
    pTVar1 = (type->field_13).structure;
    local_38 = 0;
    local_34 = 0;
    if ((offsets->super_vector<int,_glslang::pool_allocator<int>_>).
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      lVar4 = 0;
      uVar5 = 0;
      do {
        lVar3 = (**(code **)(**(long **)((long)&((pTVar1->
                                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ).
                                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->type +
                                        lVar4) + 0x50))();
        if (*(int *)(lVar3 + 0x14) != -1) {
          lVar3 = (**(code **)(**(long **)((long)&((pTVar1->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                          lVar4) + 0x50))();
          local_38 = *(int *)(lVar3 + 0x14);
        }
        TIntermediate::updateOffset
                  (type,*(TType **)
                         ((long)&((pTVar1->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar4),
                   &local_38,&local_34);
        (offsets->super_vector<int,_glslang::pool_allocator<int>_>).
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = local_38;
        local_38 = local_38 + local_34;
        uVar5 = uVar5 + 1;
        lVar4 = lVar4 + 0x20;
      } while (uVar5 < (ulong)((long)(offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                                     super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)(offsets->super_vector<int,_glslang::pool_allocator<int>_>).
                                     super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
    return;
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

void getOffsets(const TType& type, TVector<int>& offsets)
    {
        const TTypeList& memberList = *type.getStruct();
        int memberSize = 0;
        int offset = 0;

        for (size_t m = 0; m < offsets.size(); ++m) {
            // if the user supplied an offset, snap to it now
            if (memberList[m].type->getQualifier().hasOffset())
                offset = memberList[m].type->getQualifier().layoutOffset;

            // calculate the offset of the next member and align the current offset to this member
            intermediate.updateOffset(type, *memberList[m].type, offset, memberSize);

            // save the offset of this member
            offsets[m] = offset;

            // update for the next member
            offset += memberSize;
        }
    }